

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (len < 1) {
    __assert_fail("len >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                  ,0x3389,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (delta < dist) {
    __assert_fail("dist <= delta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                  ,0x338a,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (delta < rest) {
    __assert_fail("rest <= delta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                  ,0x338b,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (ten_k != 0) {
    uVar1 = dist - rest;
    if (ten_k <= delta - rest && (rest <= dist && uVar1 != 0)) {
      uVar3 = rest + ten_k;
      uVar2 = delta - uVar3;
      do {
        if ((dist <= uVar3) && (uVar1 <= uVar3 - dist)) {
          return;
        }
        if (buf[(ulong)(uint)len - 1] == '0') {
          __assert_fail("buf[len - 1] != \'0\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                        ,0x33a5,
                        "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                       );
        }
        buf[(ulong)(uint)len - 1] = buf[(ulong)(uint)len - 1] + -1;
        bVar4 = ten_k <= uVar2;
        uVar2 = uVar2 - ten_k;
        if (dist <= uVar3) {
          return;
        }
        uVar1 = uVar1 - ten_k;
        uVar3 = uVar3 + ten_k;
      } while (bVar4);
    }
    return;
  }
  __assert_fail("ten_k > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                ,0x338c,
                "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
               );
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
                         std::uint64_t rest, std::uint64_t ten_k)
{
    assert(len >= 1);
    assert(dist <= delta);
    assert(rest <= delta);
    assert(ten_k > 0);

    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    //                                  ten_k
    //                                <------>
    //                                       <---- rest ---->
    // --------------[------------------+----+--------------]--------------
    //                                  w    V
    //                                       = buf * 10^k
    //
    // ten_k represents a unit-in-the-last-place in the decimal representation
    // stored in buf.
    // Decrement buf by ten_k while this takes buf closer to w.

    // The tests are written in this order to avoid overflow in unsigned
    // integer arithmetic.

    while (rest < dist
            and delta - rest >= ten_k
            and (rest + ten_k < dist or dist - rest > rest + ten_k - dist))
    {
        assert(buf[len - 1] != '0');
        buf[len - 1]--;
        rest += ten_k;
    }
}